

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Model::clear_Type(Model *this)

{
  PipelineClassifier *this_00;
  PipelineRegressor *this_01;
  Pipeline *this_02;
  GLMRegressor *this_03;
  SupportVectorRegressor *this_04;
  TreeEnsembleRegressor *this_05;
  NeuralNetworkRegressor *this_06;
  BayesianProbitRegressor *this_07;
  GLMClassifier *this_08;
  SupportVectorClassifier *this_09;
  TreeEnsembleClassifier *this_10;
  NeuralNetworkClassifier *this_11;
  KNearestNeighborsClassifier *this_12;
  NeuralNetwork *this_13;
  ItemSimilarityRecommender *this_14;
  Program *this_15;
  CustomModel *this_16;
  LinkedModel *this_17;
  ClassConfidenceThresholding *this_18;
  OneHotEncoder *this_19;
  Imputer *this_20;
  FeatureVectorizer *this_21;
  DictVectorizer *this_22;
  Scaler *this_23;
  CategoricalMapping *this_24;
  Normalizer *this_25;
  ArrayFeatureExtractor *this_26;
  NonMaximumSuppression *this_27;
  Identity *this_28;
  TextClassifier *this_29;
  WordTagger *this_30;
  VisionFeaturePrint *this_31;
  SoundAnalysisPreprocessing *this_32;
  Gazetteer *this_33;
  WordEmbedding *this_34;
  AudioFeaturePrint *this_35;
  SerializedModel *this_36;
  TypeCase TVar1;
  Arena *pAVar2;
  Model *this_local;
  
  TVar1 = Type_case(this);
  if (TVar1 != TYPE_NOT_SET) {
    if (TVar1 == kPipelineClassifier) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_00 = (this->Type_).pipelineclassifier_, this_00 != (PipelineClassifier *)0x0)) {
        PipelineClassifier::~PipelineClassifier(this_00);
        operator_delete(this_00,0x20);
      }
    }
    else if (TVar1 == kPipelineRegressor) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_01 = (this->Type_).pipelineregressor_, this_01 != (PipelineRegressor *)0x0)) {
        PipelineRegressor::~PipelineRegressor(this_01);
        operator_delete(this_01,0x20);
      }
    }
    else if (TVar1 == kPipeline) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_02 = (this->Type_).pipeline_, this_02 != (Pipeline *)0x0)) {
        Pipeline::~Pipeline(this_02);
        operator_delete(this_02,0x48);
      }
    }
    else if (TVar1 == kGlmRegressor) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_03 = (this->Type_).glmregressor_, this_03 != (GLMRegressor *)0x0)) {
        GLMRegressor::~GLMRegressor(this_03);
        operator_delete(this_03,0x40);
      }
    }
    else if (TVar1 == kSupportVectorRegressor) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_04 = (this->Type_).supportvectorregressor_, this_04 != (SupportVectorRegressor *)0x0)
         ) {
        SupportVectorRegressor::~SupportVectorRegressor(this_04);
        operator_delete(this_04,0x38);
      }
    }
    else if (TVar1 == kTreeEnsembleRegressor) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_05 = (this->Type_).treeensembleregressor_, this_05 != (TreeEnsembleRegressor *)0x0))
      {
        TreeEnsembleRegressor::~TreeEnsembleRegressor(this_05);
        operator_delete(this_05,0x20);
      }
    }
    else if (TVar1 == kNeuralNetworkRegressor) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_06 = (this->Type_).neuralnetworkregressor_, this_06 != (NeuralNetworkRegressor *)0x0)
         ) {
        NeuralNetworkRegressor::~NeuralNetworkRegressor(this_06);
        operator_delete(this_06,0x58);
      }
    }
    else if (TVar1 == kBayesianProbitRegressor) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_07 = (this->Type_).bayesianprobitregressor_,
         this_07 != (BayesianProbitRegressor *)0x0)) {
        BayesianProbitRegressor::~BayesianProbitRegressor(this_07);
        operator_delete(this_07,0x78);
      }
    }
    else if (TVar1 == kGlmClassifier) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_08 = (this->Type_).glmclassifier_, this_08 != (GLMClassifier *)0x0)) {
        GLMClassifier::~GLMClassifier(this_08);
        operator_delete(this_08,0x50);
      }
    }
    else if (TVar1 == kSupportVectorClassifier) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_09 = (this->Type_).supportvectorclassifier_,
         this_09 != (SupportVectorClassifier *)0x0)) {
        SupportVectorClassifier::~SupportVectorClassifier(this_09);
        operator_delete(this_09,0x98);
      }
    }
    else if (TVar1 == kTreeEnsembleClassifier) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_10 = (this->Type_).treeensembleclassifier_, this_10 != (TreeEnsembleClassifier *)0x0)
         ) {
        TreeEnsembleClassifier::~TreeEnsembleClassifier(this_10);
        operator_delete(this_10,0x30);
      }
    }
    else if (TVar1 == kNeuralNetworkClassifier) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_11 = (this->Type_).neuralnetworkclassifier_,
         this_11 != (NeuralNetworkClassifier *)0x0)) {
        NeuralNetworkClassifier::~NeuralNetworkClassifier(this_11);
        operator_delete(this_11,0x68);
      }
    }
    else if (TVar1 == kKNearestNeighborsClassifier) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_12 = (this->Type_).knearestneighborsclassifier_,
         this_12 != (KNearestNeighborsClassifier *)0x0)) {
        KNearestNeighborsClassifier::~KNearestNeighborsClassifier(this_12);
        operator_delete(this_12,0x48);
      }
    }
    else if (TVar1 == kNeuralNetwork) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_13 = (this->Type_).neuralnetwork_, this_13 != (NeuralNetwork *)0x0)) {
        NeuralNetwork::~NeuralNetwork(this_13);
        operator_delete(this_13,0x58);
      }
    }
    else if (TVar1 == kItemSimilarityRecommender) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_14 = (this->Type_).itemsimilarityrecommender_,
         this_14 != (ItemSimilarityRecommender *)0x0)) {
        ItemSimilarityRecommender::~ItemSimilarityRecommender(this_14);
        operator_delete(this_14,0x70);
      }
    }
    else if (TVar1 == kMlProgram) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_15 = (this->Type_).mlprogram_, this_15 != (Program *)0x0)) {
        MILSpec::Program::~Program(this_15);
        operator_delete(this_15,0x88);
      }
    }
    else if (TVar1 == kCustomModel) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_16 = (this->Type_).custommodel_, this_16 != (CustomModel *)0x0)) {
        CustomModel::~CustomModel(this_16);
        operator_delete(this_16,0x58);
      }
    }
    else if (TVar1 == kLinkedModel) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_17 = (this->Type_).linkedmodel_, this_17 != (LinkedModel *)0x0)) {
        LinkedModel::~LinkedModel(this_17);
        operator_delete(this_17,0x20);
      }
    }
    else if (TVar1 == kClassConfidenceThresholding) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_18 = (this->Type_).classconfidencethresholding_,
         this_18 != (ClassConfidenceThresholding *)0x0)) {
        ClassConfidenceThresholding::~ClassConfidenceThresholding(this_18);
        operator_delete(this_18,0x30);
      }
    }
    else if (TVar1 == kOneHotEncoder) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_19 = (this->Type_).onehotencoder_, this_19 != (OneHotEncoder *)0x0)) {
        OneHotEncoder::~OneHotEncoder(this_19);
        operator_delete(this_19,0x28);
      }
    }
    else if (TVar1 == kImputer) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) && (this_20 = (this->Type_).imputer_, this_20 != (Imputer *)0x0))
      {
        Imputer::~Imputer(this_20);
        operator_delete(this_20,0x30);
      }
    }
    else if (TVar1 == kFeatureVectorizer) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_21 = (this->Type_).featurevectorizer_, this_21 != (FeatureVectorizer *)0x0)) {
        FeatureVectorizer::~FeatureVectorizer(this_21);
        operator_delete(this_21,0x30);
      }
    }
    else if (TVar1 == kDictVectorizer) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_22 = (this->Type_).dictvectorizer_, this_22 != (DictVectorizer *)0x0)) {
        DictVectorizer::~DictVectorizer(this_22);
        operator_delete(this_22,0x20);
      }
    }
    else if (TVar1 == kScaler) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) && (this_23 = (this->Type_).scaler_, this_23 != (Scaler *)0x0)) {
        Scaler::~Scaler(this_23);
        operator_delete(this_23,0x38);
      }
    }
    else if (TVar1 == kCategoricalMapping) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_24 = (this->Type_).categoricalmapping_, this_24 != (CategoricalMapping *)0x0)) {
        CategoricalMapping::~CategoricalMapping(this_24);
        operator_delete(this_24,0x30);
      }
    }
    else if (TVar1 == kNormalizer) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_25 = (this->Type_).normalizer_, this_25 != (Normalizer *)0x0)) {
        Normalizer::~Normalizer(this_25);
        operator_delete(this_25,0x18);
      }
    }
    else if (TVar1 == kArrayFeatureExtractor) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_26 = (this->Type_).arrayfeatureextractor_, this_26 != (ArrayFeatureExtractor *)0x0))
      {
        ArrayFeatureExtractor::~ArrayFeatureExtractor(this_26);
        operator_delete(this_26,0x28);
      }
    }
    else if (TVar1 == kNonMaximumSuppression) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_27 = (this->Type_).nonmaximumsuppression_, this_27 != (NonMaximumSuppression *)0x0))
      {
        NonMaximumSuppression::~NonMaximumSuppression(this_27);
        operator_delete(this_27,0x70);
      }
    }
    else if (TVar1 == kIdentity) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_28 = (this->Type_).identity_, this_28 != (Identity *)0x0)) {
        Identity::~Identity(this_28);
        operator_delete(this_28,0x18);
      }
    }
    else if (TVar1 == kTextClassifier) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_29 = (this->Type_).textclassifier_, this_29 != (TextClassifier *)0x0)) {
        CoreMLModels::TextClassifier::~TextClassifier(this_29);
        operator_delete(this_29,0x38);
      }
    }
    else if (TVar1 == kWordTagger) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_30 = (this->Type_).wordtagger_, this_30 != (WordTagger *)0x0)) {
        CoreMLModels::WordTagger::~WordTagger(this_30);
        operator_delete(this_30,0x58);
      }
    }
    else if (TVar1 == kVisionFeaturePrint) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_31 = (this->Type_).visionfeatureprint_, this_31 != (VisionFeaturePrint *)0x0)) {
        CoreMLModels::VisionFeaturePrint::~VisionFeaturePrint(this_31);
        operator_delete(this_31,0x20);
      }
    }
    else if (TVar1 == kSoundAnalysisPreprocessing) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_32 = (this->Type_).soundanalysispreprocessing_,
         this_32 != (SoundAnalysisPreprocessing *)0x0)) {
        CoreMLModels::SoundAnalysisPreprocessing::~SoundAnalysisPreprocessing(this_32);
        operator_delete(this_32,0x20);
      }
    }
    else if (TVar1 == kGazetteer) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_33 = (this->Type_).gazetteer_, this_33 != (Gazetteer *)0x0)) {
        CoreMLModels::Gazetteer::~Gazetteer(this_33);
        operator_delete(this_33,0x38);
      }
    }
    else if (TVar1 == kWordEmbedding) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_34 = (this->Type_).wordembedding_, this_34 != (WordEmbedding *)0x0)) {
        CoreMLModels::WordEmbedding::~WordEmbedding(this_34);
        operator_delete(this_34,0x28);
      }
    }
    else if (TVar1 == kAudioFeaturePrint) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_35 = (this->Type_).audiofeatureprint_, this_35 != (AudioFeaturePrint *)0x0)) {
        CoreMLModels::AudioFeaturePrint::~AudioFeaturePrint(this_35);
        operator_delete(this_35,0x20);
      }
    }
    else if (((TVar1 == kSerializedModel) &&
             (pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation
                                 (&this->super_MessageLite), pAVar2 == (Arena *)0x0)) &&
            (this_36 = (this->Type_).serializedmodel_, this_36 != (SerializedModel *)0x0)) {
      SerializedModel::~SerializedModel(this_36);
      operator_delete(this_36,0x28);
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void Model::clear_Type() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.Model)
  switch (Type_case()) {
    case kPipelineClassifier: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.pipelineclassifier_;
      }
      break;
    }
    case kPipelineRegressor: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.pipelineregressor_;
      }
      break;
    }
    case kPipeline: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.pipeline_;
      }
      break;
    }
    case kGlmRegressor: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.glmregressor_;
      }
      break;
    }
    case kSupportVectorRegressor: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.supportvectorregressor_;
      }
      break;
    }
    case kTreeEnsembleRegressor: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.treeensembleregressor_;
      }
      break;
    }
    case kNeuralNetworkRegressor: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.neuralnetworkregressor_;
      }
      break;
    }
    case kBayesianProbitRegressor: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.bayesianprobitregressor_;
      }
      break;
    }
    case kGlmClassifier: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.glmclassifier_;
      }
      break;
    }
    case kSupportVectorClassifier: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.supportvectorclassifier_;
      }
      break;
    }
    case kTreeEnsembleClassifier: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.treeensembleclassifier_;
      }
      break;
    }
    case kNeuralNetworkClassifier: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.neuralnetworkclassifier_;
      }
      break;
    }
    case kKNearestNeighborsClassifier: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.knearestneighborsclassifier_;
      }
      break;
    }
    case kNeuralNetwork: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.neuralnetwork_;
      }
      break;
    }
    case kItemSimilarityRecommender: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.itemsimilarityrecommender_;
      }
      break;
    }
    case kMlProgram: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.mlprogram_;
      }
      break;
    }
    case kCustomModel: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.custommodel_;
      }
      break;
    }
    case kLinkedModel: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.linkedmodel_;
      }
      break;
    }
    case kClassConfidenceThresholding: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.classconfidencethresholding_;
      }
      break;
    }
    case kOneHotEncoder: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.onehotencoder_;
      }
      break;
    }
    case kImputer: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.imputer_;
      }
      break;
    }
    case kFeatureVectorizer: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.featurevectorizer_;
      }
      break;
    }
    case kDictVectorizer: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.dictvectorizer_;
      }
      break;
    }
    case kScaler: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.scaler_;
      }
      break;
    }
    case kCategoricalMapping: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.categoricalmapping_;
      }
      break;
    }
    case kNormalizer: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.normalizer_;
      }
      break;
    }
    case kArrayFeatureExtractor: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.arrayfeatureextractor_;
      }
      break;
    }
    case kNonMaximumSuppression: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.nonmaximumsuppression_;
      }
      break;
    }
    case kIdentity: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.identity_;
      }
      break;
    }
    case kTextClassifier: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.textclassifier_;
      }
      break;
    }
    case kWordTagger: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.wordtagger_;
      }
      break;
    }
    case kVisionFeaturePrint: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.visionfeatureprint_;
      }
      break;
    }
    case kSoundAnalysisPreprocessing: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.soundanalysispreprocessing_;
      }
      break;
    }
    case kGazetteer: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.gazetteer_;
      }
      break;
    }
    case kWordEmbedding: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.wordembedding_;
      }
      break;
    }
    case kAudioFeaturePrint: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.audiofeatureprint_;
      }
      break;
    }
    case kSerializedModel: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.serializedmodel_;
      }
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = TYPE_NOT_SET;
}